

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalNinjaGenerator::FindMakeProgram(cmGlobalNinjaGenerator *this,cmMakefile *mf)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string_view str;
  cmValue cVar1;
  bool bVar2;
  string *psVar3;
  string local_1a8;
  uint local_184;
  string_view local_180;
  string_view local_170;
  string local_160;
  cmAlphaNum local_140;
  cmAlphaNum local_110;
  string local_e0;
  rep local_c0;
  undefined1 local_b8 [8];
  string error;
  string version;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue ninjaCommand;
  cmMakefile *mf_local;
  cmGlobalNinjaGenerator *this_local;
  
  ninjaCommand.Value = (string *)mf;
  bVar2 = cmGlobalGenerator::FindMakeProgram((cmGlobalGenerator *)this,mf);
  cVar1.Value = ninjaCommand.Value;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"CMAKE_MAKE_PROGRAM",&local_49);
    local_28 = cmMakefile::GetDefinition(cVar1.Value,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    bVar2 = cmValue::operator_cast_to_bool(&local_28);
    if (bVar2) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_28);
      std::__cxx11::string::operator=((string *)&this->NinjaCommand,(string *)psVar3);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&version.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&this->NinjaCommand);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[10]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (version.field_2._M_local_buf + 8),(char (*) [10])"--version");
      std::__cxx11::string::string((string *)(error.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_b8);
      local_c0 = (rep)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
      bVar2 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&version.field_2 + 8),(string *)(error.field_2._M_local_buf + 8),
                         (string *)local_b8,(int *)0x0,(char *)0x0,OUTPUT_NONE,(cmDuration)local_c0,
                         Auto);
      cVar1 = ninjaCommand;
      if (bVar2) {
        str = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(error.field_2._M_local_buf + 8));
        cmTrimWhitespace_abi_cxx11_(&local_1a8,str);
        std::__cxx11::string::operator=((string *)&this->NinjaVersion,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        CheckNinjaFeatures(this);
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_110,"Running\n \'");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_170,"\' \'")
        ;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_180);
        cmJoin(&local_160,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&version.field_2 + 8),local_170,local_180);
        cmAlphaNum::cmAlphaNum(&local_140,&local_160);
        cmStrCat<char[17],std::__cxx11::string>
                  (&local_e0,&local_110,&local_140,(char (*) [17])"\'\nfailed with:\n ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
        cmMakefile::IssueMessage((cmMakefile *)cVar1.Value,FATAL_ERROR,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_160);
        cmSystemTools::SetFatalErrorOccurred();
        this_local._7_1_ = 0;
      }
      local_184 = (uint)!bVar2;
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&version.field_2 + 8));
      if (local_184 != 0) goto LAB_005c2b0e;
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_005c2b0e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalNinjaGenerator::FindMakeProgram(cmMakefile* mf)
{
  if (!this->cmGlobalGenerator::FindMakeProgram(mf)) {
    return false;
  }
  if (cmValue ninjaCommand = mf->GetDefinition("CMAKE_MAKE_PROGRAM")) {
    this->NinjaCommand = *ninjaCommand;
    std::vector<std::string> command;
    command.push_back(this->NinjaCommand);
    command.emplace_back("--version");
    std::string version;
    std::string error;
    if (!cmSystemTools::RunSingleCommand(command, &version, &error, nullptr,
                                         nullptr,
                                         cmSystemTools::OUTPUT_NONE)) {
      mf->IssueMessage(MessageType::FATAL_ERROR,
                       cmStrCat("Running\n '", cmJoin(command, "' '"),
                                "'\n"
                                "failed with:\n ",
                                error));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    this->NinjaVersion = cmTrimWhitespace(version);
    this->CheckNinjaFeatures();
  }
  return true;
}